

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

Output * grib2dec_demo::Output::create(string *filename,string *format)

{
  bool bVar1;
  ulong uVar2;
  string *format_local;
  string *filename_local;
  
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) || (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    bVar1 = std::operator==(format,"svg");
    if (bVar1) {
      filename_local = (string *)operator_new(0x280);
      Svg::Svg((Svg *)filename_local,filename);
    }
    else {
      filename_local = (string *)operator_new(0x210);
      Txt::Txt((Txt *)filename_local,filename);
    }
  }
  else {
    filename_local = (string *)operator_new(0x210);
    anon_unknown_1::NullOutput::NullOutput((NullOutput *)filename_local);
  }
  return (Output *)filename_local;
}

Assistant:

Output *Output::create(const std::string& filename, const std::string& format)
{
    if (filename.empty() && format.empty())
        return new NullOutput();
    else if (format == "svg")
        return new Svg(filename);
    else
        // txt by default
        return new Txt(filename);
}